

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wnorm
                   (char_t *s,char_t end_quote)

{
  byte bVar1;
  long lVar2;
  char_t *pcVar3;
  long lVar4;
  byte *s_00;
  byte *pbVar5;
  bool bVar6;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  pbVar5 = (byte *)s;
  if (((anonymous_namespace)::chartype_table[(byte)*s] & 8) != 0) {
    local_38.size = 0;
    do {
      lVar4 = local_38.size + 1;
      local_38.size = local_38.size + 1;
    } while (((anonymous_namespace)::chartype_table[(byte)s[lVar4]] & 8) != 0);
    pbVar5 = (byte *)(s + local_38.size);
    local_38.end = s + local_38.size;
  }
  do {
    s_00 = pbVar5;
    if (((anonymous_namespace)::chartype_table[*pbVar5] & 0xc) == 0) {
      if (((anonymous_namespace)::chartype_table[pbVar5[1]] & 0xc) != 0) {
        s_00 = pbVar5 + 1;
        goto LAB_00193e64;
      }
      if (((anonymous_namespace)::chartype_table[pbVar5[2]] & 0xc) != 0) {
        s_00 = pbVar5 + 2;
        goto LAB_00193e64;
      }
      bVar6 = ((anonymous_namespace)::chartype_table[pbVar5[3]] & 0xc) == 0;
      s_00 = pbVar5 + 4;
      if (!bVar6) {
        s_00 = pbVar5 + 3;
      }
    }
    else {
LAB_00193e64:
      bVar6 = false;
    }
    pbVar5 = s_00;
    if (!bVar6) {
      bVar1 = *s_00;
      if (bVar1 == end_quote) {
        pcVar3 = gap::flush(&local_38,(char_t *)s_00);
        do {
          *pcVar3 = '\0';
          pbVar5 = (byte *)(pcVar3 + -1);
          pcVar3 = pcVar3 + -1;
        } while (((anonymous_namespace)::chartype_table[*pbVar5] & 8) != 0);
        return (char_t *)(s_00 + 1);
      }
      if (((anonymous_namespace)::chartype_table[bVar1] & 8) == 0) {
        if ((ulong)bVar1 == 0) {
          return (char_t *)0x0;
        }
        pbVar5 = s_00 + 1;
      }
      else {
        pbVar5 = s_00 + 1;
        *s_00 = 0x20;
        if (((anonymous_namespace)::chartype_table[s_00[1]] & 8) != 0) {
          lVar4 = 0;
          do {
            lVar2 = lVar4 + 2;
            lVar4 = lVar4 + 1;
          } while (((anonymous_namespace)::chartype_table[s_00[lVar2]] & 8) != 0);
          if ((byte *)local_38.end != (byte *)0x0) {
            if (pbVar5 < local_38.end) {
              __assert_fail("s >= end",
                            "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                            ,0x974,
                            "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
            }
            memmove(local_38.end + -local_38.size,local_38.end,(long)pbVar5 - (long)local_38.end);
          }
          pbVar5 = pbVar5 + lVar4;
          local_38.size = local_38.size + lVar4;
          local_38.end = (char_t *)pbVar5;
        }
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wnorm(char_t* s, char_t end_quote)
		{
			gap g;

			// trim leading whitespaces
			if (PUGI__IS_CHARTYPE(*s, ct_space))
			{
				char_t* str = s;

				do ++str;
				while (PUGI__IS_CHARTYPE(*str, ct_space));

				g.push(s, str - s);
			}

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_attr_ws | ct_space));

				if (*s == end_quote)
				{
					char_t* str = g.flush(s);

					do *str-- = 0;
					while (PUGI__IS_CHARTYPE(*str, ct_space));

					return s + 1;
				}
				else if (PUGI__IS_CHARTYPE(*s, ct_space))
				{
					*s++ = ' ';

					if (PUGI__IS_CHARTYPE(*s, ct_space))
					{
						char_t* str = s + 1;
						while (PUGI__IS_CHARTYPE(*str, ct_space)) ++str;

						g.push(s, str - s);
					}
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}